

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O0

void AddLinkDir(cmMakefile *mf,string *dir,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *directories)

{
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  string *str;
  PolicyID id;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  ostringstream e;
  bool convertToAbsolute;
  undefined1 local_40 [8];
  string unixPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *directories_local;
  string *dir_local;
  cmMakefile *mf_local;
  
  unixPath.field_2._8_8_ = directories;
  std::__cxx11::string::string((string *)local_40,(string *)dir);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_40);
  if ((!bVar1) &&
     (bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression((string *)local_40), !bVar1)) {
    bVar1 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar3 = std::operator<<((ostream *)local_1c8,"This command specifies the relative path\n");
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"as a link directory.\n");
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0015,false);
    switch(PVar2) {
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)local_1c8,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
    case OLD:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_228,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)local_1c8,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
    case NEW:
      bVar1 = true;
    }
    if (bVar1) {
      str = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(mf);
      cmAlphaNum::cmAlphaNum(&local_298,str);
      cmAlphaNum::cmAlphaNum(&local_2c8,'/');
      cmStrCat<std::__cxx11::string>
                (&local_268,&local_298,&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)unixPath.field_2._8_8_,(value_type *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void AddLinkDir(cmMakefile& mf, std::string const& dir,
                       std::vector<std::string>& directories)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if (!cmSystemTools::FileIsFullPath(unixPath) &&
      !cmGeneratorExpression::StartsWithGeneratorExpression(unixPath)) {
    bool convertToAbsolute = false;
    std::ostringstream e;
    /* clang-format off */
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    /* clang-format on */
    switch (mf.GetPolicyStatus(cmPolicies::CMP0015)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        mf.IssueMessage(MessageType::FATAL_ERROR, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
    }
    if (convertToAbsolute) {
      unixPath = cmStrCat(mf.GetCurrentSourceDirectory(), '/', unixPath);
    }
  }
  directories.push_back(unixPath);
}